

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonAppendObjectPathElement(JsonString *pStr,JsonNode *pNode)

{
  int iVar1;
  uint uVar2;
  char *z;
  long in_RDX;
  int nn;
  ulong uVar3;
  
  iVar1 = (int)pNode;
  if ((2 < iVar1) && ((""[*(byte *)(in_RDX + 1)] & 2) != 0)) {
    uVar2 = iVar1 - 1;
    uVar3 = 2;
    if (iVar1 != 3) {
      uVar3 = 2;
      do {
        if ((""[*(byte *)(in_RDX + uVar3)] & 6) == 0) goto LAB_001c1c8b;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
      uVar3 = (ulong)uVar2;
    }
LAB_001c1c8b:
    if ((uint)uVar3 == uVar2) {
      iVar1 = iVar1 + -2;
    }
  }
  jsonPrintf(iVar1 + 2,pStr,".%.*s");
  return;
}

Assistant:

static void jsonAppendObjectPathElement(
  JsonString *pStr,
  JsonNode *pNode
){
  int jj, nn;
  const char *z;
  assert( pNode->eType==JSON_STRING );
  assert( pNode->jnFlags & JNODE_LABEL );
  assert( pNode->eU==1 );
  z = pNode->u.zJContent;
  nn = pNode->n;
  assert( nn>=2 );
  assert( z[0]=='"' );
  assert( z[nn-1]=='"' );
  if( nn>2 && sqlite3Isalpha(z[1]) ){
    for(jj=2; jj<nn-1 && sqlite3Isalnum(z[jj]); jj++){}
    if( jj==nn-1 ){
      z++;
      nn -= 2;
    }
  }
  jsonPrintf(nn+2, pStr, ".%.*s", nn, z);
}